

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testExtendByBox<Imath_2_5::Vec4<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  reference v;
  float *pfVar7;
  char *in_RDI;
  float fVar8;
  uint k_1;
  uint k;
  Vec4<float> p1_1;
  Vec4<float> p0_1;
  uint i_1;
  Vec4<float> max;
  Vec4<float> min;
  Box<Imath_2_5::Vec4<float>_> b_1;
  uint iters;
  Rand32 rand;
  Box<Imath_2_5::Vec4<float>_> b1;
  Box<Imath_2_5::Vec4<float>_> b0;
  Vec4<float> p1;
  Vec4<float> p0;
  uint j;
  uint i;
  vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_> perms;
  Box<Imath_2_5::Vec4<float>_> b;
  float in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdcc;
  Box<Imath_2_5::Vec4<float>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  Box<Imath_2_5::Vec4<float>_> *in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  bool local_202;
  bool local_201;
  vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_> *perms_00;
  bool local_1d1;
  uint local_1b0;
  uint local_1ac;
  Vec4<float> local_1a8;
  Vec4<float> local_198;
  uint local_188;
  Vec4<float> local_184;
  Vec4<float> local_174;
  Vec4<float> local_164;
  Vec4<float> VStack_154;
  undefined4 local_144;
  Vec4<float> local_114;
  Vec4<float> aVStack_104 [3];
  Vec4<float> local_d4;
  Vec4<float> VStack_c4;
  Vec4<float> local_b4;
  Vec4<float> local_a4;
  uint local_94;
  uint local_90;
  vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_> local_80;
  Vec4<float> local_68;
  Vec4<float> local_58 [3];
  Vec4<float> local_28;
  Vec4<float> VStack_18;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box(in_stack_fffffffffffffdd0);
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box(in_stack_fffffffffffffdd0);
  Imath_2_5::Box<Imath_2_5::Vec4<float>_>::extendBy
            ((Box<Imath_2_5::Vec4<float>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (Box<Imath_2_5::Vec4<float>_> *)
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  fVar8 = Imath_2_5::Vec4<float>::baseTypeMax();
  Imath_2_5::Vec4<float>::Vec4(local_58,fVar8);
  bVar1 = Imath_2_5::Vec4<float>::operator==(&local_28,local_58);
  local_1d1 = false;
  if (bVar1) {
    fVar8 = Imath_2_5::Vec4<float>::baseTypeMin();
    Imath_2_5::Vec4<float>::Vec4(&local_68,fVar8);
    local_1d1 = Imath_2_5::Vec4<float>::operator==(&VStack_18,&local_68);
  }
  if (local_1d1 == false) {
    __assert_fail("b.min == T(T::baseTypeMax()) && b.max == T(T::baseTypeMin())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x133,
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec4<float>]"
                 );
  }
  perms_00 = &local_80;
  std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::vector
            ((vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_> *)0x114ce6);
  permutations<Imath_2_5::Vec4<float>>(perms_00);
  local_90 = 0;
  do {
    uVar5 = (ulong)local_90;
    sVar6 = std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::size
                      (&local_80);
    if (sVar6 <= uVar5) {
      std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::~vector
                ((vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_> *)
                 in_stack_fffffffffffffde0);
      Imath_2_5::Rand32::Rand32
                ((Rand32 *)in_stack_fffffffffffffdd0,
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_144 = 10;
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box(in_stack_fffffffffffffdd0);
      Imath_2_5::Vec4<float>::Vec4(&local_174);
      Imath_2_5::Vec4<float>::Vec4(&local_184);
      local_188 = 1;
      while( true ) {
        if (9 < local_188) {
          return;
        }
        Imath_2_5::Vec4<float>::Vec4(&local_198);
        Imath_2_5::Vec4<float>::Vec4(&local_1a8);
        for (local_1ac = 0; uVar2 = Imath_2_5::Vec4<float>::dimensions(), local_1ac < uVar2;
            local_1ac = local_1ac + 1) {
          in_stack_fffffffffffffdf0 =
               Imath_2_5::Rand32::nextf
                         ((Rand32 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                          in_stack_fffffffffffffdc8);
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_198,local_1ac);
          *pfVar7 = in_stack_fffffffffffffdf0;
          in_stack_fffffffffffffdf4 =
               Imath_2_5::Rand32::nextf
                         ((Rand32 *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                          in_stack_fffffffffffffdc8);
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_1a8,local_1ac);
          *pfVar7 = in_stack_fffffffffffffdf4;
        }
        Imath_2_5::Vec4<float>::operator=(&local_174,&local_164);
        Imath_2_5::Vec4<float>::operator=(&local_184,&VStack_154);
        local_1b0 = 0;
        while (uVar2 = local_1b0, uVar3 = Imath_2_5::Vec4<float>::dimensions(), uVar2 < uVar3) {
          in_stack_fffffffffffffdd0 =
               (Box<Imath_2_5::Vec4<float>_> *)
               Imath_2_5::Vec4<float>::operator[](&local_174,local_1b0);
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_198,local_1b0);
          pfVar7 = std::min<float>((float *)in_stack_fffffffffffffdd0,pfVar7);
          in_stack_fffffffffffffddc = *pfVar7;
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_174,local_1b0);
          *pfVar7 = in_stack_fffffffffffffddc;
          in_stack_fffffffffffffde0 =
               (Box<Imath_2_5::Vec4<float>_> *)
               Imath_2_5::Vec4<float>::operator[](&local_184,local_1b0);
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_1a8,local_1b0);
          pfVar7 = std::max<float>((float *)in_stack_fffffffffffffde0,pfVar7);
          in_stack_fffffffffffffde8 = *pfVar7;
          pfVar7 = Imath_2_5::Vec4<float>::operator[](&local_184,local_1b0);
          *pfVar7 = in_stack_fffffffffffffde8;
          local_1b0 = local_1b0 + 1;
        }
        Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
                  (in_stack_fffffffffffffde0,
                   (Vec4<float> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   &in_stack_fffffffffffffdd0->min);
        Imath_2_5::Box<Imath_2_5::Vec4<float>_>::extendBy
                  ((Box<Imath_2_5::Vec4<float>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   (Box<Imath_2_5::Vec4<float>_> *)CONCAT44(uVar2,in_stack_fffffffffffffde8));
        bVar1 = Imath_2_5::Vec4<float>::operator==(&local_164,&local_174);
        in_stack_fffffffffffffdcc = (float)((uint)in_stack_fffffffffffffdcc & 0xffffff);
        if (bVar1) {
          bVar1 = Imath_2_5::Vec4<float>::operator==(&VStack_154,&local_184);
          in_stack_fffffffffffffdcc = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffdcc,0));
        }
        if ((char)((uint)in_stack_fffffffffffffdcc >> 0x18) == '\0') break;
        local_188 = local_188 + 1;
      }
      __assert_fail("b.min == min && b.max == max",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                    ,0x16c,
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec4<float>]"
                   );
    }
    for (local_94 = 0; uVar5 = (ulong)local_94,
        sVar6 = std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::size
                          (&local_80), uVar5 < sVar6; local_94 = local_94 + 1) {
      std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::operator[]
                (&local_80,(ulong)local_90);
      Imath_2_5::Vec4<float>::operator-
                ((Vec4<float> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      v = std::vector<Imath_2_5::Vec4<float>,_std::allocator<Imath_2_5::Vec4<float>_>_>::operator[]
                    (&local_80,(ulong)local_94);
      Imath_2_5::Vec4<float>::Vec4(&local_b4,v);
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box(in_stack_fffffffffffffdd0);
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
                (in_stack_fffffffffffffde0,
                 (Vec4<float> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 &in_stack_fffffffffffffdd0->min);
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::extendBy
                ((Box<Imath_2_5::Vec4<float>_> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (Box<Imath_2_5::Vec4<float>_> *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      bVar1 = Imath_2_5::Vec4<float>::operator==(&local_d4,&local_a4);
      local_201 = false;
      if (bVar1) {
        local_201 = Imath_2_5::Vec4<float>::operator==(&VStack_c4,&local_b4);
      }
      if (local_201 == false) {
        __assert_fail("b0.min == p0 && b0.max == p1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                      ,0x146,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec4<float>]"
                     );
      }
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box
                (in_stack_fffffffffffffde0,
                 (Vec4<float> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 &in_stack_fffffffffffffdd0->min);
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::Box(in_stack_fffffffffffffdd0);
      Imath_2_5::Box<Imath_2_5::Vec4<float>_>::extendBy
                ((Box<Imath_2_5::Vec4<float>_> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (Box<Imath_2_5::Vec4<float>_> *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      bVar1 = Imath_2_5::Vec4<float>::operator==(&local_114,&local_a4);
      local_202 = false;
      if (bVar1) {
        local_202 = Imath_2_5::Vec4<float>::operator==(aVStack_104,&local_b4);
      }
      if (local_202 == false) {
        __assert_fail("b1.min == p0 && b1.max == p1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec4<float>]"
                     );
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void
testExtendByBox(const char *type)
{
    cout << "    extendBy() box for type " << type << endl;

    //
    // Extend empty box with an empty box;
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>());
        assert(b.min == T(T::baseTypeMax()) &&
               b.max == T(T::baseTypeMin()));
    }

    //
    // Extend empty box with a non-empty box and vice versa.
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            for (unsigned int j = 0; j < perms.size(); j++)
            {
                T p0 = -perms[i];
                T p1 =  perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                b0.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>(p0, p1));
                assert(b0.min == p0 && b0.max == p1);

                IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
                b1.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>());
                assert(b1.min == p0 && b1.max == p1);
            }
        }
    }
        
    //
    // Extend non-empty box with non-empty box. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand(0);
    const unsigned int iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0;
            T p1;
            for (unsigned int k = 0; k < T::dimensions(); k++)
            {
                p0[k] = typename T::BaseType (rand.nextf(   0,  999));
                p1[k] = typename T::BaseType (rand.nextf(1000, 1999));
            }

            min = b.min;
            max = b.max;
            for (unsigned int k = 0; k < T::dimensions(); k++)
            {
                min[k] = std::min(min[k], p0[k]);
                max[k] = std::max(max[k], p1[k]);
            }
            b.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>(p0, p1));

            assert(b.min == min && b.max == max);
        }
    }
}